

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O0

djpeg_dest_ptr jinit_write_bmp(j_decompress_ptr cinfo,boolean is_os2,boolean use_inversion_array)

{
  long lVar1;
  djpeg_dest_ptr pdVar2;
  _func_void_j_decompress_ptr_djpeg_dest_ptr_JDIMENSION *p_Var3;
  JSAMPARRAY ppJVar4;
  int iVar5;
  int in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  cd_progress_ptr progress;
  JDIMENSION row_width;
  bmp_dest_ptr dest;
  uint local_1c;
  
  pdVar2 = (djpeg_dest_ptr)(**(code **)in_RDI[1])(in_RDI,1,0x68);
  pdVar2->start_output = start_output_bmp;
  pdVar2->finish_output = finish_output_bmp;
  pdVar2->calc_buffer_dimensions = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)0x0;
  *(undefined4 *)&pdVar2[1].start_output = in_ESI;
  if ((int)in_RDI[8] == 1) {
    pdVar2->put_pixel_rows = put_gray_rows;
  }
  else if (((int)in_RDI[8] == 2) || ((5 < *(uint *)(in_RDI + 8) && (*(uint *)(in_RDI + 8) < 0x10))))
  {
    if (*(int *)((long)in_RDI + 0x6c) == 0) {
      pdVar2->put_pixel_rows = put_pixel_rows;
    }
    else {
      pdVar2->put_pixel_rows = put_gray_rows;
    }
  }
  else if ((*(int *)((long)in_RDI + 0x6c) == 0) &&
          (((int)in_RDI[8] == 0x10 || ((int)in_RDI[8] == 4)))) {
    pdVar2->put_pixel_rows = put_pixel_rows;
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x3ed;
    (**(code **)*in_RDI)(in_RDI);
  }
  jpeg_calc_output_dimensions((j_decompress_ptr)progress);
  if ((int)in_RDI[8] == 0x10) {
    lVar1 = in_RDI[0x11];
    iVar5 = (int)in_RDI[0x11] * 3;
    *(int *)&pdVar2[1].finish_output = iVar5;
    *(int *)((long)&pdVar2[1].finish_output + 4) = iVar5;
    for (local_1c = (int)lVar1 << 1; (local_1c & 3) != 0; local_1c = local_1c + 1) {
    }
  }
  else if ((*(int *)((long)in_RDI + 0x6c) == 0) &&
          (((int)in_RDI[8] == 2 ||
           (((5 < *(uint *)(in_RDI + 8) && (*(uint *)(in_RDI + 8) < 0x10)) || ((int)in_RDI[8] == 4))
           )))) {
    local_1c = (int)in_RDI[0x11] * *(int *)((long)in_RDI + 0x94);
    iVar5 = (int)in_RDI[0x11] * 3;
    *(int *)&pdVar2[1].finish_output = iVar5;
    *(int *)((long)&pdVar2[1].finish_output + 4) = iVar5;
  }
  else {
    local_1c = (int)in_RDI[0x11] * *(int *)((long)in_RDI + 0x94);
    *(uint *)&pdVar2[1].finish_output = local_1c;
    *(uint *)((long)&pdVar2[1].finish_output + 4) = local_1c;
  }
  while (((ulong)pdVar2[1].finish_output & 0x300000000) != 0) {
    *(int *)((long)&pdVar2[1].finish_output + 4) = *(int *)((long)&pdVar2[1].finish_output + 4) + 1;
  }
  *(int *)&pdVar2[1].calc_buffer_dimensions =
       *(int *)((long)&pdVar2[1].finish_output + 4) - *(int *)&pdVar2[1].finish_output;
  if (in_EDX == 0) {
    ppJVar4 = (JSAMPARRAY)
              (**(code **)in_RDI[1])(in_RDI,1,*(undefined4 *)((long)&pdVar2[1].finish_output + 4));
    pdVar2[1].buffer = ppJVar4;
  }
  else {
    p_Var3 = (_func_void_j_decompress_ptr_djpeg_dest_ptr_JDIMENSION *)
             (**(code **)(in_RDI[1] + 0x20))
                       (in_RDI,1,0,*(undefined4 *)((long)&pdVar2[1].finish_output + 4),
                        *(undefined4 *)((long)in_RDI + 0x8c));
    pdVar2[1].put_pixel_rows = p_Var3;
    *(undefined4 *)((long)&pdVar2[1].calc_buffer_dimensions + 4) = 0;
    if (in_RDI[2] != 0) {
      *(int *)(in_RDI[2] + 0x24) = *(int *)(in_RDI[2] + 0x24) + 1;
    }
  }
  *(int *)&pdVar2[1].output_file = in_EDX;
  ppJVar4 = (JSAMPARRAY)(**(code **)(in_RDI[1] + 0x10))(in_RDI,1,local_1c);
  pdVar2->buffer = ppJVar4;
  pdVar2->buffer_height = 1;
  return pdVar2;
}

Assistant:

GLOBAL(djpeg_dest_ptr)
jinit_write_bmp(j_decompress_ptr cinfo, boolean is_os2,
                boolean use_inversion_array)
{
  bmp_dest_ptr dest;
  JDIMENSION row_width;

  /* Create module interface object, fill in method pointers */
  dest = (bmp_dest_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(bmp_dest_struct));
  dest->pub.start_output = start_output_bmp;
  dest->pub.finish_output = finish_output_bmp;
  dest->pub.calc_buffer_dimensions = NULL;
  dest->is_os2 = is_os2;

  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    dest->pub.put_pixel_rows = put_gray_rows;
  } else if (IsExtRGB(cinfo->out_color_space)) {
    if (cinfo->quantize_colors)
      dest->pub.put_pixel_rows = put_gray_rows;
    else
      dest->pub.put_pixel_rows = put_pixel_rows;
  } else if (!cinfo->quantize_colors &&
             (cinfo->out_color_space == JCS_RGB565 ||
              cinfo->out_color_space == JCS_CMYK)) {
    dest->pub.put_pixel_rows = put_pixel_rows;
  } else {
    ERREXIT(cinfo, JERR_BMP_COLORSPACE);
  }

  /* Calculate output image dimensions so we can allocate space */
  jpeg_calc_output_dimensions(cinfo);

  /* Determine width of rows in the BMP file (padded to 4-byte boundary). */
  if (cinfo->out_color_space == JCS_RGB565) {
    row_width = cinfo->output_width * 2;
    dest->row_width = dest->data_width = cinfo->output_width * 3;
    while ((row_width & 3) != 0) row_width++;
  } else if (!cinfo->quantize_colors &&
             (IsExtRGB(cinfo->out_color_space) ||
              cinfo->out_color_space == JCS_CMYK)) {
    row_width = cinfo->output_width * cinfo->output_components;
    dest->row_width = dest->data_width = cinfo->output_width * 3;
  } else {
    row_width = cinfo->output_width * cinfo->output_components;
    dest->row_width = dest->data_width = row_width;
  }
  while ((dest->row_width & 3) != 0) dest->row_width++;
  dest->pad_bytes = (int)(dest->row_width - dest->data_width);


  if (use_inversion_array) {
    /* Allocate space for inversion array, prepare for write pass */
    dest->whole_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       dest->row_width, cinfo->output_height, (JDIMENSION)1);
    dest->cur_output_row = 0;
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
  } else {
    dest->iobuffer = (JSAMPLE *)(*cinfo->mem->alloc_small)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, dest->row_width);
  }
  dest->use_inversion_array = use_inversion_array;

  /* Create decompressor output buffer. */
  dest->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, row_width, (JDIMENSION)1);
  dest->pub.buffer_height = 1;

  return (djpeg_dest_ptr)dest;
}